

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Vector4f *in_RDX;
  Matrix4f *in_RSI;
  Vector4f *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector4f VVar7;
  int j;
  int i;
  Vector4f *output;
  undefined4 local_20;
  undefined4 local_1c;
  
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  Vector4f::Vector4f(in_RDI,0.0,0.0,0.0,0.0);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      pfVar4 = Matrix4f::operator()(in_RSI,local_1c,local_20);
      fVar1 = *pfVar4;
      pfVar4 = Vector4f::operator[](in_RDX,local_20);
      fVar2 = *pfVar4;
      pfVar4 = Vector4f::operator[](in_RDI,local_1c);
      auVar6 = ZEXT464((uint)fVar1);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
      auVar5 = ZEXT1664(auVar3);
      *pfVar4 = auVar3._0_4_;
    }
  }
  VVar7.m_elements._0_8_ = auVar5._0_8_;
  VVar7.m_elements._8_8_ = auVar6._0_8_;
  return (Vector4f)VVar7.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}